

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop_x86_avx2.cpp
# Opt level: O0

int __thiscall
ncnn::Crop_x86_avx2::forward
          (Crop_x86_avx2 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  long lVar1;
  bool bVar2;
  int *piVar3;
  Crop *this_00;
  int iVar4;
  int iVar5;
  undefined8 *in_RCX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long *in_RDI;
  int **ppiVar6;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> bottom_blobs_unpacked;
  Option opt_pack1_1;
  Mat reference_blob_unpacked;
  Option opt_pack1;
  Mat bottom_blob_unpacked;
  Mat borderm_3;
  Mat m_3;
  int z_1;
  int q_3;
  Mat bottom_blob_sliced_3;
  size_t out_elemsize_7;
  int out_elempack_7;
  Mat borderm_2;
  Mat m_2;
  int q_2;
  Mat bottom_blob_sliced_2;
  size_t out_elemsize_6;
  int out_elempack_6;
  size_t out_elemsize_5;
  int out_elempack_5;
  size_t out_elemsize_4;
  int out_elempack_4;
  int _outc_1;
  int _outd_1;
  int _outh_1;
  int _outw_1;
  int _coffset_1;
  int _doffset_1;
  int _hoffset_1;
  int _woffset_1;
  Mat borderm_1;
  Mat m_1;
  int z;
  int q_1;
  Mat bottom_blob_sliced_1;
  size_t out_elemsize_3;
  int out_elempack_3;
  Mat borderm;
  Mat m;
  int q;
  Mat bottom_blob_sliced;
  size_t out_elemsize_2;
  int out_elempack_2;
  size_t out_elemsize_1;
  int out_elempack_1;
  size_t out_elemsize;
  int out_elempack;
  int _outc;
  int _outd;
  int _outh;
  int _outw;
  int _coffset;
  int _doffset;
  int _hoffset;
  int _woffset;
  Mat *top_blob;
  int ref_elempack;
  int elempack;
  size_t elemsize;
  int dims;
  int channels;
  int d;
  int h;
  int w;
  Mat *reference_blob;
  Mat *bottom_blob;
  Mat *in_stack_fffffffffffff548;
  Mat *in_stack_fffffffffffff550;
  Mat *pMVar7;
  Mat *in_stack_fffffffffffff558;
  allocator_type *in_stack_fffffffffffff560;
  Mat *in_stack_fffffffffffff568;
  int in_stack_fffffffffffff570;
  int in_stack_fffffffffffff574;
  Mat *in_stack_fffffffffffff578;
  int in_stack_fffffffffffff580;
  int in_stack_fffffffffffff584;
  int top;
  undefined4 in_stack_fffffffffffff588;
  undefined4 in_stack_fffffffffffff58c;
  int in_stack_fffffffffffff590;
  undefined4 in_stack_fffffffffffff594;
  undefined4 uVar8;
  int in_stack_fffffffffffff5a0;
  int in_stack_fffffffffffff5a4;
  undefined4 in_stack_fffffffffffff5a8;
  undefined4 in_stack_fffffffffffff5ac;
  Mat *in_stack_fffffffffffff5b0;
  int local_a28;
  int local_a14;
  int local_a10;
  int local_a0c;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> local_9e0;
  undefined8 local_9c8;
  undefined8 uStack_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 local_9a8;
  undefined8 uStack_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 uStack_920;
  undefined8 local_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined8 uStack_900;
  int local_788;
  int local_784;
  Mat local_780;
  undefined1 local_738 [72];
  long local_6f0;
  int local_6e4;
  Option *in_stack_fffffffffffff9a0;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_stack_fffffffffffff9a8;
  undefined4 in_stack_fffffffffffff9b0;
  undefined4 in_stack_fffffffffffff9b4;
  Crop *in_stack_fffffffffffff9b8;
  undefined1 local_600 [72];
  long local_5b8;
  int local_5ac;
  long local_5a8;
  int local_59c;
  long local_598;
  int local_58c;
  Mat local_588;
  Mat local_540;
  Mat local_4f8;
  undefined1 local_4b0 [4];
  int local_4ac;
  undefined1 local_4a8 [8];
  Mat local_4a0 [4];
  int local_370;
  int local_36c;
  Mat local_368;
  undefined1 local_320 [72];
  long local_2d8;
  int local_2cc;
  int local_238;
  undefined4 local_234;
  Mat local_230;
  undefined1 local_1e8 [72];
  long local_1a0;
  int local_194;
  long local_190;
  int local_184;
  long local_180;
  int local_174;
  Mat local_170;
  Mat local_128;
  Mat local_d0;
  undefined1 local_88 [4];
  int local_84;
  undefined1 local_80 [8];
  Mat local_78;
  const_reference local_30;
  undefined8 *local_28;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_20;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_18;
  int local_4;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_30 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  local_78.cstep =
       (size_t)std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,1);
  local_78._60_4_ = local_30->w;
  local_78.c = local_30->h;
  local_78.d = local_30->d;
  local_78.h = local_30->c;
  local_78.w = local_30->dims;
  local_78.allocator = (Allocator *)local_30->elemsize;
  local_78._28_4_ = local_30->elempack;
  local_78.elempack = ((const_reference)local_78.cstep)->elempack;
  local_78.elemsize =
       (size_t)std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,0);
  if (local_78._28_4_ == 8) {
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == -0xe9) {
      lVar1 = *(long *)(*in_RDI + -0x18);
      Mat::shape(in_stack_fffffffffffff568);
      piVar3 = Mat::operator_cast_to_int_((Mat *)local_78.cstep);
      in_stack_fffffffffffff568 = (Mat *)local_88;
      in_stack_fffffffffffff560 = (allocator_type *)&local_84;
      in_stack_fffffffffffff558 = (Mat *)local_80;
      in_stack_fffffffffffff550 = (Mat *)(local_80 + 4);
      in_stack_fffffffffffff548 = &local_78;
      ppiVar6 = &local_78.refcount;
      Crop::resolve_crop_roi
                ((Crop *)((long)in_RDI + lVar1),&local_d0,piVar3,
                 (int *)((long)&local_78.refcount + 4),(int *)ppiVar6,
                 (int *)((long)&local_78.data + 4),(int *)in_stack_fffffffffffff548,
                 (int *)in_stack_fffffffffffff550,(int *)in_stack_fffffffffffff558,
                 (int *)in_stack_fffffffffffff560,(int *)in_stack_fffffffffffff568);
      Mat::~Mat((Mat *)0x387bbb);
    }
    else {
      lVar1 = *(long *)(*in_RDI + -0x18);
      Mat::shape(in_stack_fffffffffffff568);
      Mat::shape(in_stack_fffffffffffff568);
      in_stack_fffffffffffff568 = (Mat *)local_88;
      in_stack_fffffffffffff560 = (allocator_type *)&local_84;
      in_stack_fffffffffffff558 = (Mat *)local_80;
      in_stack_fffffffffffff550 = (Mat *)(local_80 + 4);
      in_stack_fffffffffffff548 = &local_78;
      ppiVar6 = &local_78.refcount;
      Crop::resolve_crop_roi
                ((Crop *)((long)in_RDI + lVar1),&local_128,&local_170,
                 (int *)((long)&local_78.refcount + 4),(int *)ppiVar6,
                 (int *)((long)&local_78.data + 4),(int *)in_stack_fffffffffffff548,
                 (int *)in_stack_fffffffffffff550,(int *)in_stack_fffffffffffff558,
                 (int *)in_stack_fffffffffffff560,(int *)in_stack_fffffffffffff568);
      Mat::~Mat((Mat *)0x387cae);
      Mat::~Mat((Mat *)0x387cbb);
    }
    iVar4 = (int)((ulong)in_stack_fffffffffffff558 >> 0x20);
    iVar5 = (int)((ulong)in_stack_fffffffffffff568 >> 0x20);
    if (local_78.w == 1) {
      if ((int)local_80._4_4_ % 8 == 0) {
        local_a0c = 8;
      }
      else {
        local_a0c = 1;
        if ((int)local_80._4_4_ % 4 == 0) {
          local_a0c = 4;
        }
      }
      local_174 = local_a0c;
      local_180 = ((ulong)local_78.allocator / (ulong)(long)(int)local_78._28_4_) * (long)local_a0c;
      if (((int)local_80._4_4_ / local_a0c == local_78._60_4_) && (local_a0c == 8)) {
        Mat::operator=(in_stack_fffffffffffff558,in_stack_fffffffffffff550);
        return 0;
      }
      if ((local_78.refcount._4_4_ % 8 == 0) && (local_a0c == 8)) {
        Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),iVar5,
                    (size_t)in_stack_fffffffffffff560,iVar4,(Allocator *)in_stack_fffffffffffff550);
        bVar2 = Mat::empty(in_stack_fffffffffffff550);
        if (!bVar2) {
          crop_pack8_avx(in_stack_fffffffffffff5b0,
                         (Mat *)CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8),
                         in_stack_fffffffffffff5a4,in_stack_fffffffffffff5a0);
          return 0;
        }
        return -100;
      }
    }
    if (local_78.w == 2) {
      if ((int)local_80._0_4_ % 8 == 0) {
        local_a10 = 8;
      }
      else {
        local_a10 = 1;
        if ((int)local_80._0_4_ % 4 == 0) {
          local_a10 = 4;
        }
      }
      local_184 = local_a10;
      local_190 = ((ulong)local_78.allocator / (ulong)(long)(int)local_78._28_4_) * (long)local_a10;
      if (((local_80._4_4_ == local_78._60_4_) && ((int)local_80._0_4_ / local_a10 == local_78.c))
         && (local_a10 == 8)) {
        Mat::operator=(in_stack_fffffffffffff558,in_stack_fffffffffffff550);
        return 0;
      }
      if (((int)local_78.refcount % 8 == 0) && (local_a10 == 8)) {
        Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),iVar5,
                    (int)in_stack_fffffffffffff568,(size_t)in_stack_fffffffffffff560,iVar4,
                    (Allocator *)in_stack_fffffffffffff550);
        bVar2 = Mat::empty(in_stack_fffffffffffff550);
        if (!bVar2) {
          crop_pack8_avx(in_stack_fffffffffffff5b0,
                         (Mat *)CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8),
                         in_stack_fffffffffffff5a4,in_stack_fffffffffffff5a0);
          return 0;
        }
        return -100;
      }
    }
    if (local_78.w == 3) {
      if ((int)local_88 % 8 == 0) {
        local_a14 = 8;
      }
      else {
        local_a14 = 1;
        if ((int)local_88 % 4 == 0) {
          local_a14 = 4;
        }
      }
      local_194 = local_a14;
      local_1a0 = ((ulong)local_78.allocator / (ulong)(long)(int)local_78._28_4_) * (long)local_a14;
      if (((local_80._4_4_ == local_78._60_4_) && (local_80._0_4_ == local_78.c)) &&
         (((int)local_88 / local_a14 == local_78.h && (local_a14 == 8)))) {
        Mat::operator=(in_stack_fffffffffffff558,in_stack_fffffffffffff550);
        return 0;
      }
      if (((int)local_78.data % 8 == 0) && (local_a14 == 8)) {
        iVar4 = (int)local_88 / 8;
        Mat::channel_range(in_stack_fffffffffffff578,in_stack_fffffffffffff574,
                           in_stack_fffffffffffff570);
        iVar5 = (int)((ulong)in_stack_fffffffffffff560 >> 0x20);
        if ((local_80._4_4_ == local_78._60_4_) && (local_80._0_4_ == local_78.c)) {
          Mat::clone(&local_230,(__fn *)local_1e8,(void *)0x0,iVar4,ppiVar6);
          Mat::operator=(in_stack_fffffffffffff558,in_stack_fffffffffffff550);
          Mat::~Mat((Mat *)0x388207);
          bVar2 = Mat::empty(in_stack_fffffffffffff550);
          if (bVar2) {
            local_4 = -100;
            goto LAB_0038842e;
          }
        }
        Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
                    (int)((ulong)in_stack_fffffffffffff568 >> 0x20),(int)in_stack_fffffffffffff568,
                    iVar5,(size_t)in_stack_fffffffffffff558,
                    (int)((ulong)in_stack_fffffffffffff550 >> 0x20),
                    (Allocator *)CONCAT44(in_stack_fffffffffffff584,in_stack_fffffffffffff580));
        bVar2 = Mat::empty(in_stack_fffffffffffff550);
        if (bVar2) {
          local_4 = -100;
        }
        else {
          for (local_238 = 0; local_238 < *(int *)(local_78.elemsize + 0x38);
              local_238 = local_238 + 1) {
            Mat::channel(in_stack_fffffffffffff578,in_stack_fffffffffffff574);
            Mat::channel(in_stack_fffffffffffff578,in_stack_fffffffffffff574);
            crop_pack8_avx(in_stack_fffffffffffff5b0,
                           (Mat *)CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8),
                           in_stack_fffffffffffff5a4,in_stack_fffffffffffff5a0);
            Mat::~Mat((Mat *)0x3883af);
            Mat::~Mat((Mat *)0x3883bc);
          }
          local_4 = 0;
        }
LAB_0038842e:
        local_234 = 1;
        Mat::~Mat((Mat *)0x38843b);
        return local_4;
      }
    }
    if (local_78.w == 4) {
      if ((int)local_88 % 8 == 0) {
        local_a28 = 8;
      }
      else {
        local_a28 = 1;
        if ((int)local_88 % 4 == 0) {
          local_a28 = 4;
        }
      }
      local_2cc = local_a28;
      local_2d8 = ((ulong)local_78.allocator / (ulong)(long)(int)local_78._28_4_) * (long)local_a28;
      if ((((local_80._4_4_ == local_78._60_4_) && (local_80._0_4_ == local_78.c)) &&
          (local_84 == local_78.d)) &&
         (((int)local_88 / local_a28 == local_78.h && (local_a28 == 8)))) {
        Mat::operator=(in_stack_fffffffffffff558,in_stack_fffffffffffff550);
        return 0;
      }
      if (((int)local_78.data % 8 == 0) && (local_a28 == 8)) {
        iVar4 = (int)local_88 / 8;
        Mat::channel_range(in_stack_fffffffffffff578,in_stack_fffffffffffff574,
                           in_stack_fffffffffffff570);
        if (((local_80._4_4_ == local_78._60_4_) && (local_80._0_4_ == local_78.c)) &&
           (local_84 == local_78.d)) {
          Mat::clone(&local_368,(__fn *)local_320,(void *)0x0,iVar4,ppiVar6);
          Mat::operator=(in_stack_fffffffffffff558,in_stack_fffffffffffff550);
          Mat::~Mat((Mat *)0x38863c);
          bVar2 = Mat::empty(in_stack_fffffffffffff550);
          if (bVar2) {
            local_4 = -100;
            goto LAB_0038894e;
          }
        }
        pMVar7 = (Mat *)local_28[1];
        Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
                    (int)((ulong)in_stack_fffffffffffff568 >> 0x20),(int)in_stack_fffffffffffff568,
                    (int)((ulong)in_stack_fffffffffffff560 >> 0x20),(int)in_stack_fffffffffffff560,
                    (size_t)in_stack_fffffffffffff558,in_stack_fffffffffffff580,
                    (Allocator *)CONCAT44(in_stack_fffffffffffff58c,in_stack_fffffffffffff588));
        bVar2 = Mat::empty(pMVar7);
        if (bVar2) {
          local_4 = -100;
        }
        else {
          for (local_36c = 0; local_36c < *(int *)(local_78.elemsize + 0x38);
              local_36c = local_36c + 1) {
            for (local_370 = 0; local_370 < local_84; local_370 = local_370 + 1) {
              Mat::channel(in_stack_fffffffffffff578,in_stack_fffffffffffff574);
              Mat::depth(in_stack_fffffffffffff558,(int)((ulong)pMVar7 >> 0x20));
              Mat::~Mat((Mat *)0x3887f3);
              Mat::channel(in_stack_fffffffffffff578,in_stack_fffffffffffff574);
              Mat::depth(in_stack_fffffffffffff558,(int)((ulong)pMVar7 >> 0x20));
              Mat::~Mat((Mat *)0x38883c);
              crop_pack8_avx(in_stack_fffffffffffff5b0,
                             (Mat *)CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8),
                             in_stack_fffffffffffff5a4,in_stack_fffffffffffff5a0);
              Mat::~Mat((Mat *)0x38886e);
              Mat::~Mat((Mat *)0x38887b);
            }
          }
          local_4 = 0;
        }
LAB_0038894e:
        local_234 = 1;
        Mat::~Mat((Mat *)0x38895b);
        return local_4;
      }
    }
  }
  if (local_78._28_4_ != 4) {
LAB_003897c1:
    Mat::Mat(in_stack_fffffffffffff550,in_stack_fffffffffffff548);
    if (local_78._28_4_ != 1) {
      local_938 = *local_28;
      uStack_928 = local_28[2];
      uStack_920 = local_28[3];
      local_918 = local_28[4];
      uStack_910 = local_28[5];
      uStack_908 = local_28[6];
      uStack_900 = local_28[7];
      uStack_930 = local_28[2];
      convert_packing((Mat *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590),
                      (Mat *)CONCAT44(in_stack_fffffffffffff58c,in_stack_fffffffffffff588),
                      in_stack_fffffffffffff584,(Option *)in_stack_fffffffffffff578);
    }
    Mat::Mat(in_stack_fffffffffffff550,in_stack_fffffffffffff548);
    if (local_78.elempack != 1) {
      local_9c8 = *local_28;
      uStack_9b8 = local_28[2];
      uStack_9b0 = local_28[3];
      local_9a8 = local_28[4];
      uStack_9a0 = local_28[5];
      uStack_998 = local_28[6];
      uStack_990 = local_28[7];
      uStack_9c0 = local_28[2];
      convert_packing((Mat *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590),
                      (Mat *)CONCAT44(in_stack_fffffffffffff58c,in_stack_fffffffffffff588),
                      in_stack_fffffffffffff584,(Option *)in_stack_fffffffffffff578);
    }
    std::allocator<ncnn::Mat>::allocator((allocator<ncnn::Mat> *)0x389905);
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
              ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
               CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
               (size_type)in_stack_fffffffffffff568,in_stack_fffffffffffff560);
    std::allocator<ncnn::Mat>::~allocator((allocator<ncnn::Mat> *)0x38992b);
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](&local_9e0,0);
    Mat::operator=(in_stack_fffffffffffff558,in_stack_fffffffffffff550);
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](&local_9e0,1);
    Mat::operator=(in_stack_fffffffffffff558,in_stack_fffffffffffff550);
    local_4 = Crop::forward(in_stack_fffffffffffff9b8,
                            (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                            CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0),
                            in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0);
    local_234 = 1;
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
              ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)in_stack_fffffffffffff560);
    Mat::~Mat((Mat *)0x3899d7);
    Mat::~Mat((Mat *)0x3899e4);
    return local_4;
  }
  if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == -0xe9) {
    lVar1 = *(long *)(*in_RDI + -0x18);
    Mat::shape(in_stack_fffffffffffff568);
    piVar3 = Mat::operator_cast_to_int_((Mat *)local_78.cstep);
    in_stack_fffffffffffff568 = (Mat *)local_4b0;
    in_stack_fffffffffffff560 = (allocator_type *)&local_4ac;
    in_stack_fffffffffffff558 = (Mat *)local_4a8;
    in_stack_fffffffffffff550 = (Mat *)(local_4a8 + 4);
    in_stack_fffffffffffff548 = local_4a0;
    ppiVar6 = &local_4a0[0].refcount;
    Crop::resolve_crop_roi
              ((Crop *)((long)in_RDI + lVar1),&local_4f8,piVar3,
               (int *)((long)&local_4a0[0].refcount + 4),(int *)ppiVar6,
               (int *)((long)&local_4a0[0].data + 4),(int *)in_stack_fffffffffffff548,
               (int *)in_stack_fffffffffffff550,(int *)in_stack_fffffffffffff558,
               (int *)in_stack_fffffffffffff560,(int *)in_stack_fffffffffffff568);
    Mat::~Mat((Mat *)0x388a60);
  }
  else {
    this_00 = (Crop *)((long)in_RDI + *(long *)(*in_RDI + -0x18));
    Mat::shape(in_stack_fffffffffffff568);
    Mat::shape(in_stack_fffffffffffff568);
    in_stack_fffffffffffff568 = (Mat *)local_4b0;
    in_stack_fffffffffffff560 = (allocator_type *)&local_4ac;
    in_stack_fffffffffffff558 = (Mat *)local_4a8;
    in_stack_fffffffffffff550 = (Mat *)(local_4a8 + 4);
    in_stack_fffffffffffff548 = local_4a0;
    ppiVar6 = &local_4a0[0].refcount;
    Crop::resolve_crop_roi
              (this_00,&local_540,&local_588,(int *)((long)&local_4a0[0].refcount + 4),
               (int *)ppiVar6,(int *)((long)&local_4a0[0].data + 4),(int *)in_stack_fffffffffffff548
               ,(int *)in_stack_fffffffffffff550,(int *)in_stack_fffffffffffff558,
               (int *)in_stack_fffffffffffff560,(int *)in_stack_fffffffffffff568);
    Mat::~Mat((Mat *)0x388b4d);
    Mat::~Mat((Mat *)0x388b5a);
  }
  iVar4 = (int)((ulong)in_stack_fffffffffffff558 >> 0x20);
  iVar5 = (int)((ulong)in_stack_fffffffffffff568 >> 0x20);
  if (local_78.w == 1) {
    if ((int)local_4a8._4_4_ % 8 == 0) {
      local_58c = 8;
    }
    else {
      local_58c = 1;
      if ((int)local_4a8._4_4_ % 4 == 0) {
        local_58c = 4;
      }
    }
    local_598 = ((ulong)local_78.allocator / (ulong)(long)(int)local_78._28_4_) * (long)local_58c;
    if (((int)local_4a8._4_4_ / local_58c == local_78._60_4_) && (local_58c == 4)) {
      Mat::operator=(in_stack_fffffffffffff558,in_stack_fffffffffffff550);
      return 0;
    }
    if ((local_4a0[0].refcount._4_4_ % 4 == 0) && (local_58c == 4)) {
      Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),iVar5,
                  (size_t)in_stack_fffffffffffff560,iVar4,(Allocator *)in_stack_fffffffffffff550);
      bVar2 = Mat::empty(in_stack_fffffffffffff550);
      if (!bVar2) {
        crop_pack4_sse((Mat *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590),
                       (Mat *)CONCAT44(in_stack_fffffffffffff58c,in_stack_fffffffffffff588),
                       in_stack_fffffffffffff584,in_stack_fffffffffffff580);
        return 0;
      }
      return -100;
    }
  }
  if (local_78.w == 2) {
    if ((int)local_4a8._0_4_ % 8 == 0) {
      local_59c = 8;
    }
    else {
      local_59c = 1;
      if ((int)local_4a8._0_4_ % 4 == 0) {
        local_59c = 4;
      }
    }
    local_5a8 = ((ulong)local_78.allocator / (ulong)(long)(int)local_78._28_4_) * (long)local_59c;
    if (((local_4a8._4_4_ == local_78._60_4_) && ((int)local_4a8._0_4_ / local_59c == local_78.c))
       && (local_59c == 4)) {
      Mat::operator=(in_stack_fffffffffffff558,in_stack_fffffffffffff550);
      return 0;
    }
    if (((int)local_4a0[0].refcount % 4 == 0) && (local_59c == 4)) {
      Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),iVar5,
                  (int)in_stack_fffffffffffff568,(size_t)in_stack_fffffffffffff560,iVar4,
                  (Allocator *)in_stack_fffffffffffff550);
      bVar2 = Mat::empty(in_stack_fffffffffffff550);
      if (!bVar2) {
        crop_pack4_sse((Mat *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590),
                       (Mat *)CONCAT44(in_stack_fffffffffffff58c,in_stack_fffffffffffff588),
                       in_stack_fffffffffffff584,in_stack_fffffffffffff580);
        return 0;
      }
      return -100;
    }
  }
  if (local_78.w == 3) {
    if ((int)local_4b0 % 8 == 0) {
      local_5ac = 8;
    }
    else {
      local_5ac = 1;
      if ((int)local_4b0 % 4 == 0) {
        local_5ac = 4;
      }
    }
    local_5b8 = ((ulong)local_78.allocator / (ulong)(long)(int)local_78._28_4_) * (long)local_5ac;
    if (((local_4a8._4_4_ == local_78._60_4_) && (local_4a8._0_4_ == local_78.c)) &&
       (((int)local_4b0 / local_5ac == local_78.h && (local_5ac == 4)))) {
      Mat::operator=(in_stack_fffffffffffff558,in_stack_fffffffffffff550);
      return 0;
    }
    if (((int)local_4a0[0].data % 4 == 0) && (local_5ac == 4)) {
      iVar4 = (int)local_4b0 / 4;
      Mat::channel_range(in_stack_fffffffffffff578,in_stack_fffffffffffff574,
                         in_stack_fffffffffffff570);
      iVar5 = (int)((ulong)in_stack_fffffffffffff560 >> 0x20);
      if ((local_4a8._4_4_ == local_78._60_4_) && (local_4a8._0_4_ == local_78.c)) {
        Mat::clone((Mat *)&stack0xfffffffffffff9b8,(__fn *)local_600,(void *)0x0,iVar4,ppiVar6);
        Mat::operator=(in_stack_fffffffffffff558,in_stack_fffffffffffff550);
        Mat::~Mat((Mat *)0x389085);
        bVar2 = Mat::empty(in_stack_fffffffffffff550);
        if (bVar2) {
          local_4 = -100;
          goto LAB_0038929a;
        }
      }
      Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
                  (int)((ulong)in_stack_fffffffffffff568 >> 0x20),(int)in_stack_fffffffffffff568,
                  iVar5,(size_t)in_stack_fffffffffffff558,
                  (int)((ulong)in_stack_fffffffffffff550 >> 0x20),
                  (Allocator *)CONCAT44(in_stack_fffffffffffff584,in_stack_fffffffffffff580));
      bVar2 = Mat::empty(in_stack_fffffffffffff550);
      uVar8 = CONCAT13(bVar2,(int3)in_stack_fffffffffffff594);
      if (bVar2) {
        local_4 = -100;
      }
      else {
        for (iVar4 = 0; iVar4 < *(int *)(local_78.elemsize + 0x38); iVar4 = iVar4 + 1) {
          Mat::channel(in_stack_fffffffffffff578,in_stack_fffffffffffff574);
          Mat::channel(in_stack_fffffffffffff578,in_stack_fffffffffffff574);
          crop_pack4_sse((Mat *)CONCAT44(uVar8,in_stack_fffffffffffff590),
                         (Mat *)CONCAT44(in_stack_fffffffffffff58c,in_stack_fffffffffffff588),
                         in_stack_fffffffffffff584,in_stack_fffffffffffff580);
          Mat::~Mat((Mat *)0x38921b);
          Mat::~Mat((Mat *)0x389228);
        }
        local_4 = 0;
      }
LAB_0038929a:
      local_234 = 1;
      Mat::~Mat((Mat *)0x3892a7);
      return local_4;
    }
  }
  if (local_78.w != 4) goto LAB_003897c1;
  if ((int)local_4b0 % 8 == 0) {
    in_stack_fffffffffffff590 = 8;
  }
  else {
    in_stack_fffffffffffff590 = 1;
    if ((int)local_4b0 % 4 == 0) {
      in_stack_fffffffffffff590 = 4;
    }
  }
  local_6f0 = ((ulong)local_78.allocator / (ulong)(long)(int)local_78._28_4_) *
              (long)in_stack_fffffffffffff590;
  local_6e4 = in_stack_fffffffffffff590;
  if ((((local_4a8._4_4_ == local_78._60_4_) && (local_4a8._0_4_ == local_78.c)) &&
      (local_4ac == local_78.d)) &&
     (((int)local_4b0 / in_stack_fffffffffffff590 == local_78.h && (in_stack_fffffffffffff590 == 4))
     )) {
    Mat::operator=(in_stack_fffffffffffff558,in_stack_fffffffffffff550);
    return 0;
  }
  if (((int)local_4a0[0].data % 4 != 0) || (in_stack_fffffffffffff590 != 4)) goto LAB_003897c1;
  iVar4 = (int)local_4a0[0].data / 4;
  iVar5 = (int)local_4b0 / 4;
  Mat::channel_range(in_stack_fffffffffffff578,in_stack_fffffffffffff574,in_stack_fffffffffffff570);
  if (((local_4a8._4_4_ == local_78._60_4_) && (local_4a8._0_4_ == local_78.c)) &&
     (local_4ac == local_78.d)) {
    Mat::clone(&local_780,(__fn *)local_738,(void *)0x0,iVar5,ppiVar6);
    Mat::operator=(in_stack_fffffffffffff558,in_stack_fffffffffffff550);
    Mat::~Mat((Mat *)0x389499);
    bVar2 = Mat::empty(in_stack_fffffffffffff550);
    in_stack_fffffffffffff588 = CONCAT13(bVar2,(int3)in_stack_fffffffffffff588);
    if (bVar2) {
      local_4 = -100;
      goto LAB_00389799;
    }
  }
  pMVar7 = (Mat *)local_28[1];
  Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
              (int)((ulong)in_stack_fffffffffffff568 >> 0x20),(int)in_stack_fffffffffffff568,
              (int)((ulong)in_stack_fffffffffffff560 >> 0x20),(int)in_stack_fffffffffffff560,
              (size_t)in_stack_fffffffffffff558,in_stack_fffffffffffff580,
              (Allocator *)CONCAT44(iVar4,in_stack_fffffffffffff588));
  bVar2 = Mat::empty(pMVar7);
  iVar5 = CONCAT13(bVar2,(int3)in_stack_fffffffffffff580);
  if (bVar2) {
    local_4 = -100;
  }
  else {
    top = local_4a8._0_4_;
    for (local_784 = 0; local_784 < *(int *)(local_78.elemsize + 0x38); local_784 = local_784 + 1) {
      for (local_788 = 0; local_788 < local_4ac; local_788 = local_788 + 1) {
        Mat::channel(in_stack_fffffffffffff578,in_stack_fffffffffffff574);
        Mat::depth(in_stack_fffffffffffff558,(int)((ulong)pMVar7 >> 0x20));
        Mat::~Mat((Mat *)0x38963e);
        Mat::channel(in_stack_fffffffffffff578,in_stack_fffffffffffff574);
        Mat::depth(in_stack_fffffffffffff558,(int)((ulong)pMVar7 >> 0x20));
        Mat::~Mat((Mat *)0x389687);
        crop_pack4_sse((Mat *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590),
                       (Mat *)CONCAT44(iVar4,in_stack_fffffffffffff588),top,iVar5);
        Mat::~Mat((Mat *)0x3896b9);
        Mat::~Mat((Mat *)0x3896c6);
      }
    }
    local_4 = 0;
  }
LAB_00389799:
  local_234 = 1;
  Mat::~Mat((Mat *)0x3897a6);
  return local_4;
}

Assistant:

int Crop_x86_avx2::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& reference_blob = bottom_blobs[1];

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    int ref_elempack = reference_blob.elempack;

    Mat& top_blob = top_blobs[0];

#if __SSE2__
#if __AVX__
    if (elempack == 8)
    {
        int _woffset, _hoffset, _doffset, _coffset;
        int _outw, _outh, _outd, _outc;
        if (woffset == -233)
        {
            resolve_crop_roi(bottom_blob.shape(), (const int*)reference_blob, _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
        }
        else
        {
            resolve_crop_roi(bottom_blob.shape(), reference_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
        }

        if (dims == 1)
        {
            int out_elempack = _outw % 8 == 0 ? 8 : _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 8 == 0 && out_elempack == 8)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack8_avx(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 8 == 0 ? 8 : _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 8 == 0 && out_elempack == 8)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack8_avx(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 8 == 0 && out_elempack == 8)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);
                    crop_pack8_avx(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 8 == 0 && out_elempack == 8)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);
                        crop_pack8_avx(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX__

    if (elempack == 4)
    {
        int _woffset, _hoffset, _doffset, _coffset;
        int _outw, _outh, _outd, _outc;
        if (woffset == -233)
        {
            resolve_crop_roi(bottom_blob.shape(), (const int*)reference_blob, _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
        }
        else
        {
            resolve_crop_roi(bottom_blob.shape(), reference_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
        }

        if (dims == 1)
        {
#if __AVX__
            int out_elempack = _outw % 8 == 0 ? 8 : _outw % 4 == 0 ? 4 : 1;
#else
            int out_elempack = _outw % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 4 == 0 && out_elempack == 4)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack4_sse(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
#if __AVX__
            int out_elempack = _outh % 8 == 0 ? 8 : _outh % 4 == 0 ? 4 : 1;
#else
            int out_elempack = _outh % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 4 == 0 && out_elempack == 4)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack4_sse(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
#if __AVX__
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
#else
            int out_elempack = _outc % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 4 == 0 && out_elempack == 4)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);

                    crop_pack4_sse(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
#if __AVX__
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
#else
            int out_elempack = _outc % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 4 == 0 && out_elempack == 4)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);

                        crop_pack4_sse(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    Mat bottom_blob_unpacked = bottom_blob;
    if (elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack1);
    }

    Mat reference_blob_unpacked = reference_blob;
    if (ref_elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(reference_blob, reference_blob_unpacked, 1, opt_pack1);
    }

    std::vector<Mat> bottom_blobs_unpacked(2);
    bottom_blobs_unpacked[0] = bottom_blob_unpacked;
    bottom_blobs_unpacked[1] = reference_blob_unpacked;

    return Crop::forward(bottom_blobs_unpacked, top_blobs, opt);
}